

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delete.cpp
# Opt level: O3

void __thiscall setup::delete_entry::load(delete_entry *this,istream *is,info *i)

{
  target_type tVar1;
  logger *plVar2;
  char buffer [4];
  logger local_198;
  
  if ((i->version).value < 0x1030000) {
    std::istream::read((char *)is,(long)&local_198);
  }
  util::encoded_string::load(is,&this->name,i->codepage,&(i->header).lead_bytes);
  item::load_condition_data(&this->super_item,is,i);
  windows_version_range::load(&(this->super_item).winver,is,&i->version);
  std::istream::read((char *)is,(long)&local_198);
  if ((ulong)(byte)(undefined1)local_198.level < 3) {
    tVar1 = *(target_type *)
             ((anonymous_namespace)::delete_target_type_map::values +
             (ulong)(byte)(undefined1)local_198.level * 4);
  }
  else {
    local_198.level = Warning;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198.buffer);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198.buffer,"Unexpected ",0xb);
    plVar2 = logger::operator<<(&local_198,&enum_names<setup::delete_entry::target_type>::name);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&plVar2->buffer," value: ",8);
    std::ostream::_M_insert<unsigned_long>((ulong)&plVar2->buffer);
    logger::~logger(&local_198);
    tVar1 = Files;
  }
  this->type = tVar1;
  return;
}

Assistant:

void delete_entry::load(std::istream & is, const info & i) {
	
	if(i.version < INNO_VERSION(1, 3, 0)) {
		(void)util::load<boost::uint32_t>(is); // uncompressed size of the entry
	}
	
	is >> util::encoded_string(name, i.codepage, i.header.lead_bytes);
	
	load_condition_data(is, i);
	
	load_version_data(is, i.version);
	
	type = stored_enum<delete_target_type_map>(is).get();
}